

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

CompressedTexFormat glu::mapGLCompressedTexFormat(deUint32 format)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  deUint32 local_10;
  CompressedTexFormat local_c;
  deUint32 format_local;
  
  if (format == 0x8d64) {
    local_c = COMPRESSEDTEXFORMAT_ETC1_RGB8;
  }
  else if (format == 0x9270) {
    local_c = COMPRESSEDTEXFORMAT_EAC_R11;
  }
  else if (format == 0x9271) {
    local_c = COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
  }
  else if (format == 0x9272) {
    local_c = COMPRESSEDTEXFORMAT_EAC_RG11;
  }
  else if (format == 0x9273) {
    local_c = COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;
  }
  else if (format == 0x9274) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_RGB8;
  }
  else if (format == 0x9275) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_SRGB8;
  }
  else if (format == 0x9276) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
  }
  else if (format == 0x9277) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
  }
  else if (format == 0x9278) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
  }
  else if (format == 0x9279) {
    local_c = COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;
  }
  else if (format == 0x93b0) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
  }
  else if (format == 0x93b1) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
  }
  else if (format == 0x93b2) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
  }
  else if (format == 0x93b3) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
  }
  else if (format == 0x93b4) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
  }
  else if (format == 0x93b5) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
  }
  else if (format == 0x93b6) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
  }
  else if (format == 0x93b7) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
  }
  else if (format == 0x93b8) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
  }
  else if (format == 0x93b9) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
  }
  else if (format == 0x93ba) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
  }
  else if (format == 0x93bb) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
  }
  else if (format == 0x93bc) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
  }
  else if (format == 0x93bd) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
  }
  else if (format == 0x93d0) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
  }
  else if (format == 0x93d1) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
  }
  else if (format == 0x93d2) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
  }
  else if (format == 0x93d3) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
  }
  else if (format == 0x93d4) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
  }
  else if (format == 0x93d5) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
  }
  else if (format == 0x93d6) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
  }
  else if (format == 0x93d7) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
  }
  else if (format == 0x93d8) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
  }
  else if (format == 0x93d9) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
  }
  else if (format == 0x93da) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
  }
  else if (format == 0x93db) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
  }
  else if (format == 0x93dc) {
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
  }
  else {
    if (format != 0x93dd) {
      local_10 = format;
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Can\'t map compressed GL format to compressed format",
                 &local_31);
      tcu::InternalError::InternalError(this,&local_30);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;
  }
  return local_c;
}

Assistant:

tcu::CompressedTexFormat mapGLCompressedTexFormat (deUint32 format)
{
	switch (format)
	{
		case GL_ETC1_RGB8_OES:								return tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8;
		case GL_COMPRESSED_R11_EAC:							return tcu::COMPRESSEDTEXFORMAT_EAC_R11;
		case GL_COMPRESSED_SIGNED_R11_EAC:					return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
		case GL_COMPRESSED_RG11_EAC:						return tcu::COMPRESSEDTEXFORMAT_EAC_RG11;
		case GL_COMPRESSED_SIGNED_RG11_EAC:					return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;
		case GL_COMPRESSED_RGB8_ETC2:						return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8;
		case GL_COMPRESSED_SRGB8_ETC2:						return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8;
		case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:	return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
		case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:	return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
		case GL_COMPRESSED_RGBA8_ETC2_EAC:					return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:			return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;

		case GL_COMPRESSED_RGBA_ASTC_4x4_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_5x4_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_5x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_6x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_6x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x8_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x8_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x10_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_12x10_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_12x12_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;

		default:
			throw tcu::InternalError("Can't map compressed GL format to compressed format");
	}
}